

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::metricToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,metric_name mn)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(mn) {
  case f1score:
    __s = "f1score";
    __a = &local_9;
    break;
  case f1scoreLabel:
    __s = "f1scoreLabel";
    __a = &local_a;
    break;
  case precisionAtRecall:
    __s = "precisionAtRecall";
    __a = &local_b;
    break;
  case precisionAtRecallLabel:
    __s = "precisionAtRecallLabel";
    __a = &local_c;
    break;
  case recallAtPrecision:
    __s = "recallAtPrecision";
    __a = &local_d;
    break;
  case recallAtPrecisionLabel:
    __s = "recallAtPrecisionLabel";
    __a = &local_e;
    break;
  default:
    __s = "Unknown metric name!";
    __a = &local_f;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::f1scoreLabel:
      return "f1scoreLabel";
    case metric_name::precisionAtRecall:
      return "precisionAtRecall";
    case metric_name::precisionAtRecallLabel:
      return "precisionAtRecallLabel";
    case metric_name::recallAtPrecision:
      return "recallAtPrecision";
    case metric_name::recallAtPrecisionLabel:
      return "recallAtPrecisionLabel";
  }
  return "Unknown metric name!"; // should never happen
}